

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

Frag __thiscall
re2::Regexp::Walker<re2::Frag>::WalkInternal
          (Walker<re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  ushort uVar1;
  uint uVar2;
  deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *pdVar3;
  undefined8 *puVar4;
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  *psVar5;
  Regexp *pRVar6;
  undefined4 *puVar7;
  _Map_pointer ppWVar8;
  WalkState<re2::Frag> *pWVar9;
  bool bVar10;
  PatchList extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar11;
  PatchList extraout_var_00;
  Frag FVar12;
  PatchList extraout_var_02;
  Frag *pFVar13;
  WalkState<re2::Frag> *pWVar14;
  int iVar15;
  _Elt_pointer pWVar16;
  ulong uVar17;
  bool stop;
  Frag local_1b8;
  undefined1 local_1b0 [20];
  uint32_t uStack_19c;
  PatchList PStack_198;
  uint32_t uStack_194;
  PatchList PStack_190;
  uint uStack_18c;
  Frag *local_188;
  PatchList extraout_var_01;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/walker-inl.h"
               ,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessage::~LogMessage((LogMessage *)local_1b0);
    uVar17 = (ulong)top_arg >> 0x20;
  }
  else {
    pdVar3 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
             this->stack_;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = top_arg.begin;
    local_1b0._16_4_ = top_arg.end.p;
    local_188 = (Frag *)0x0;
    uStack_19c = 0;
    PStack_198.p = 0;
    uStack_194 = 0;
    PStack_190.p = 0;
    puVar4 = *(undefined8 **)(pdVar3 + 0x30);
    local_1b0._0_8_ = re;
    if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
      std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>::
      _M_push_back_aux<re2::WalkState<re2::Frag>>(pdVar3,(WalkState<re2::Frag> *)local_1b0);
    }
    else {
      puVar4[4] = (ulong)uStack_18c << 0x20;
      puVar4[5] = 0;
      puVar4[2] = (ulong)(uint)local_1b0._16_4_;
      puVar4[3] = 0;
      *puVar4 = re;
      *(undefined4 *)(puVar4 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar4 + 0xc) = local_1b0._12_4_;
      *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
    }
    do {
      psVar5 = this->stack_;
      pWVar16 = (psVar5->c).
                super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar16 ==
          (psVar5->c).
          super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar16 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar6 = pWVar16[-1].re;
      uVar17 = 0;
      local_1b8.begin = 0;
      local_1b8.end.p = 0;
      if (pWVar16[-1].n == -1) {
        iVar15 = this->max_visits_;
        this->max_visits_ = iVar15 + -1;
        if (iVar15 < 1) {
          this->stopped_early_ = true;
          local_1b8.begin = (*this->_vptr_Walker[5])(this,pRVar6,pWVar16[-1].parent_arg);
          local_1b8.end.p = extraout_var_00.p;
          uVar17 = (ulong)extraout_var_00.p;
        }
        else {
          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
          local_1b8.begin = (*this->_vptr_Walker[2])(this,pRVar6,pWVar16[-1].parent_arg);
          local_1b8.end.p = extraout_var.p;
          pWVar16[-1].pre_arg = local_1b8;
          bVar10 = local_1b0[0];
          if (local_1b0[0] == true) {
            uVar17 = (ulong)extraout_var.p;
          }
          else {
            pWVar16[-1].n = 0;
            pWVar16[-1].child_args = (Frag *)0x0;
            uVar1 = pRVar6->nsub_;
            uVar17 = (ulong)uVar1;
            if (uVar1 == 0) {
              local_1b8.end.p = 0;
              local_1b8.begin = (uint)uVar1;
            }
            else if (uVar1 == 1) {
              pWVar16[-1].child_args = &pWVar16[-1].child_arg;
              uVar17 = 0;
              local_1b8.begin = 0;
              local_1b8.end.p = 0;
            }
            else {
              pFVar13 = (Frag *)operator_new__((ulong)uVar1 << 3);
              memset(pFVar13,0,(ulong)uVar1 << 3);
              pWVar16[-1].child_args = pFVar13;
              local_1b8.begin = 0;
              local_1b8.end.p = 0;
              uVar17 = 0;
            }
          }
          if (bVar10 == false) goto LAB_001c1624;
        }
LAB_001c183c:
        std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::pop_back
                  (&this->stack_->c);
        psVar5 = this->stack_;
        ppWVar8 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        pWVar14 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pWVar9 = (psVar5->c).
                 super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        iVar15 = 1;
        if (((long)pWVar14 - (long)pWVar9 >> 4) * -0x5555555555555555 +
            (((long)ppWVar8 -
              (long)(psVar5->c).
                    super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppWVar8 == (_Map_pointer)0x0)) * 10 !=
            ((long)(psVar5->c).
                   super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(psVar5->c).
                   super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) {
          if (pWVar14 == pWVar9) {
            pWVar14 = ppWVar8[-1] + 10;
          }
          if (pWVar14[-1].child_args == (Frag *)0x0) {
            pFVar13 = &pWVar14[-1].child_arg;
          }
          else {
            pFVar13 = pWVar14[-1].child_args + pWVar14[-1].n;
          }
          *pFVar13 = (Frag)((ulong)local_1b8 & 0xffffffff | uVar17 << 0x20);
          pWVar14[-1].n = pWVar14[-1].n + 1;
          iVar15 = 0;
        }
      }
      else {
LAB_001c1624:
        uVar1 = pRVar6->nsub_;
        if (uVar1 == 0) {
LAB_001c17cb:
          local_1b8.begin =
               (*this->_vptr_Walker[3])
                         (this,pRVar6,pWVar16[-1].parent_arg,pWVar16[-1].pre_arg,
                          pWVar16[-1].child_args,(ulong)(uint)pWVar16[-1].n);
          local_1b8.end.p = extraout_var_02.p;
          uVar17 = (ulong)extraout_var_02.p;
          if ((1 < pRVar6->nsub_) && (pWVar16[-1].child_args != (Frag *)0x0)) {
            operator_delete__(pWVar16[-1].child_args);
          }
          goto LAB_001c183c;
        }
        if (uVar1 == 1) {
          paVar11 = &pRVar6->field_5;
        }
        else {
          paVar11 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar6->field_5).submany_;
        }
        uVar2 = pWVar16[-1].n;
        iVar15 = 0;
        if ((int)uVar2 < (int)(uint)uVar1) {
          if (((int)uVar2 < 1 || !use_copy) ||
             ((Regexp *)paVar11[uVar2 - 1].submany_ != (Regexp *)paVar11[uVar2].submany_)) {
            pdVar3 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
                     this->stack_;
            local_1b0._0_8_ = paVar11[pWVar16[-1].n].submany_;
            local_1b0._8_4_ = -1;
            local_1b0._12_4_ = pWVar16[-1].pre_arg.begin;
            local_1b0._16_4_ = pWVar16[-1].pre_arg.end;
            local_188 = (Frag *)0x0;
            uStack_19c = 0;
            PStack_198.p = 0;
            uStack_194 = 0;
            PStack_190.p = 0;
            puVar7 = *(undefined4 **)(pdVar3 + 0x30);
            if (puVar7 == (undefined4 *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
              std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>::
              _M_push_back_aux<re2::WalkState<re2::Frag>>(pdVar3,(WalkState<re2::Frag> *)local_1b0);
            }
            else {
              local_1b0._4_4_ = (undefined4)((ulong)local_1b0._0_8_ >> 0x20);
              *(ulong *)(puVar7 + 8) = (ulong)uStack_18c << 0x20;
              *(undefined8 *)(puVar7 + 10) = 0;
              *(ulong *)(puVar7 + 4) = (ulong)(uint)local_1b0._16_4_;
              *(undefined8 *)(puVar7 + 6) = 0;
              *puVar7 = local_1b0._0_4_;
              puVar7[1] = local_1b0._4_4_;
              puVar7[2] = 0xffffffff;
              puVar7[3] = local_1b0._12_4_;
              *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
            }
          }
          else {
            FVar12.begin = (*this->_vptr_Walker[4])(this,pWVar16[-1].child_args[uVar2 - 1]);
            FVar12.end.p = extraout_var_01.p;
            pWVar16[-1].child_args[pWVar16[-1].n] = FVar12;
            pWVar16[-1].n = pWVar16[-1].n + 1;
          }
          iVar15 = 3;
        }
        if ((int)(uint)uVar1 <= (int)uVar2) goto LAB_001c17cb;
      }
    } while ((iVar15 == 0) || (top_arg = local_1b8, iVar15 == 3));
  }
  return (Frag)((ulong)top_arg & 0xffffffff | uVar17 << 0x20);
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}